

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightBounds * pbrt::Union(LightBounds *__return_storage_ptr__,LightBounds *a,LightBounds *b)

{
  Float FVar1;
  Float FVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  bool bVar16;
  bool bVar17;
  float __x;
  float fVar18;
  float fVar19;
  undefined8 uVar20;
  undefined8 uVar24;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar32;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined8 uVar33;
  undefined8 uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  DirectionCone c;
  DirectionCone local_70;
  DirectionCone local_58;
  DirectionCone local_40;
  
  if ((a->phi != 0.0) || (NAN(a->phi))) {
    if ((b->phi != 0.0) || (NAN(b->phi))) {
      FVar1 = a->cosTheta_o;
      fVar19 = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar21 = ZEXT416((uint)(a->w).super_Tuple3<pbrt::Vector3,_float>.x);
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar19)),auVar21,auVar21);
      auVar22 = ZEXT416((uint)(a->w).super_Tuple3<pbrt::Vector3,_float>.z);
      auVar21 = vfmadd213ss_fma(auVar22,auVar22,auVar21);
      if (auVar21._0_4_ < 0.0) {
        local_70.w.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(auVar21._0_4_);
      }
      else {
        auVar21 = vsqrtss_avx(auVar21,auVar21);
        local_70.w.super_Tuple3<pbrt::Vector3,_float>.z = auVar21._0_4_;
      }
      uVar4 = (a->w).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar10 = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar21._4_4_ = uVar10;
      auVar21._0_4_ = uVar4;
      auVar21._8_8_ = 0;
      auVar22._4_4_ = local_70.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar22._0_4_ = local_70.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar22._8_4_ = local_70.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar22._12_4_ = local_70.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar21 = vdivps_avx(auVar21,auVar22);
      local_70.w.super_Tuple3<pbrt::Vector3,_float>.z =
           (a->w).super_Tuple3<pbrt::Vector3,_float>.z /
           local_70.w.super_Tuple3<pbrt::Vector3,_float>.z;
      local_70.w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar21);
      local_70.empty = false;
      FVar2 = b->cosTheta_o;
      fVar19 = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar21 = ZEXT416((uint)(b->w).super_Tuple3<pbrt::Vector3,_float>.x);
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar19)),auVar21,auVar21);
      auVar22 = ZEXT416((uint)(b->w).super_Tuple3<pbrt::Vector3,_float>.z);
      auVar21 = vfmadd213ss_fma(auVar22,auVar22,auVar21);
      local_70.cosTheta = FVar1;
      if (auVar21._0_4_ < 0.0) {
        local_40.w.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(auVar21._0_4_);
      }
      else {
        auVar21 = vsqrtss_avx(auVar21,auVar21);
        local_40.w.super_Tuple3<pbrt::Vector3,_float>.z = auVar21._0_4_;
      }
      uVar5 = (b->w).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar11 = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar28._4_4_ = uVar11;
      auVar28._0_4_ = uVar5;
      auVar28._8_8_ = 0;
      auVar35._4_4_ = local_40.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar35._0_4_ = local_40.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar35._8_4_ = local_40.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar35._12_4_ = local_40.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar21 = vdivps_avx(auVar28,auVar35);
      local_40.w.super_Tuple3<pbrt::Vector3,_float>.z =
           (b->w).super_Tuple3<pbrt::Vector3,_float>.z /
           local_40.w.super_Tuple3<pbrt::Vector3,_float>.z;
      local_40.w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar21);
      local_40.empty = false;
      local_40.cosTheta = FVar2;
      Union(&local_58,&local_70,&local_40);
      auVar21 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_58.cosTheta));
      uVar20 = vcmpss_avx512f(ZEXT416((uint)local_58.cosTheta),SUB6416(ZEXT464(0xbf800000),0),1);
      bVar17 = (bool)((byte)uVar20 & 1);
      __x = acosf((float)((uint)bVar17 * -0x40800000 + (uint)!bVar17 * auVar21._0_4_));
      uVar6 = (b->b).pMin.super_Tuple3<pbrt::Point3,_float>.x;
      uVar12 = (b->b).pMin.super_Tuple3<pbrt::Point3,_float>.y;
      auVar23._4_4_ = uVar12;
      auVar23._0_4_ = uVar6;
      auVar23._8_8_ = 0;
      uVar7 = (a->b).pMin.super_Tuple3<pbrt::Point3,_float>.x;
      uVar13 = (a->b).pMin.super_Tuple3<pbrt::Point3,_float>.y;
      auVar29._4_4_ = uVar13;
      auVar29._0_4_ = uVar7;
      auVar29._8_8_ = 0;
      auVar28 = vminps_avx(auVar23,auVar29);
      uVar8 = (a->b).pMax.super_Tuple3<pbrt::Point3,_float>.x;
      uVar14 = (a->b).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      auVar30._4_4_ = uVar14;
      auVar30._0_4_ = uVar8;
      auVar30._8_8_ = 0;
      auVar29 = vminss_avx(ZEXT416((uint)(b->b).pMin.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(a->b).pMin.super_Tuple3<pbrt::Point3,_float>.z));
      uVar9 = (b->b).pMax.super_Tuple3<pbrt::Point3,_float>.x;
      uVar15 = (b->b).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      auVar37._4_4_ = uVar15;
      auVar37._0_4_ = uVar9;
      auVar37._8_8_ = 0;
      auVar21 = vmaxps_avx(auVar37,auVar30);
      auVar22 = vmaxss_avx(ZEXT416((uint)(b->b).pMax.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(a->b).pMax.super_Tuple3<pbrt::Point3,_float>.z));
      fVar19 = a->phi;
      fVar3 = b->phi;
      auVar23 = vmaxss_avx(ZEXT416((uint)b->theta_e),ZEXT416((uint)a->theta_e));
      bVar17 = b->twoSided;
      bVar16 = a->twoSided;
      uVar20 = vmovlps_avx(auVar28);
      (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar20;
      (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar20 >> 0x20);
      (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar29._0_4_;
      uVar20 = vmovlps_avx(auVar21);
      (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar20;
      (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar20 >> 0x20);
      (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar22._0_4_;
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(local_58.w.super_Tuple3<pbrt::Vector3,_float>.y *
                                              local_58.w.super_Tuple3<pbrt::Vector3,_float>.y)),
                                ZEXT416((uint)local_58.w.super_Tuple3<pbrt::Vector3,_float>.x),
                                ZEXT416((uint)local_58.w.super_Tuple3<pbrt::Vector3,_float>.x));
      auVar21 = vfmadd213ss_fma(ZEXT416((uint)local_58.w.super_Tuple3<pbrt::Vector3,_float>.z),
                                ZEXT416((uint)local_58.w.super_Tuple3<pbrt::Vector3,_float>.z),
                                auVar21);
      if (auVar21._0_4_ < 0.0) {
        fVar18 = sqrtf(auVar21._0_4_);
      }
      else {
        auVar21 = vsqrtss_avx(auVar21,auVar21);
        fVar18 = auVar21._0_4_;
      }
      auVar31._4_4_ = local_58.w.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar31._0_4_ = local_58.w.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar31._8_8_ = 0;
      auVar36._4_4_ = fVar18;
      auVar36._0_4_ = fVar18;
      auVar36._8_4_ = fVar18;
      auVar36._12_4_ = fVar18;
      auVar21 = vdivps_avx(auVar31,auVar36);
      uVar20 = vmovlps_avx(auVar21);
      (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar20;
      (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar20 >> 0x20);
      (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z =
           local_58.w.super_Tuple3<pbrt::Vector3,_float>.z / fVar18;
      __return_storage_ptr__->phi = fVar19 + fVar3;
      __return_storage_ptr__->theta_o = __x;
      __return_storage_ptr__->theta_e = auVar23._0_4_;
      fVar19 = cosf(__x);
      __return_storage_ptr__->cosTheta_o = fVar19;
      fVar19 = cosf(auVar23._0_4_);
      __return_storage_ptr__->cosTheta_e = fVar19;
      __return_storage_ptr__->twoSided = (bool)(bVar17 | bVar16);
      return __return_storage_ptr__;
    }
    uVar20._0_4_ = (a->b).pMin.super_Tuple3<pbrt::Point3,_float>.x;
    uVar20._4_4_ = (a->b).pMin.super_Tuple3<pbrt::Point3,_float>.y;
    uVar24 = *(undefined8 *)&(a->b).pMin.super_Tuple3<pbrt::Point3,_float>.z;
    uVar25._0_4_ = (a->b).pMax.super_Tuple3<pbrt::Point3,_float>.y;
    uVar25._4_4_ = (a->b).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar26._0_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar26._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar27._0_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar27._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar32._0_4_ = a->phi;
    uVar32._4_4_ = a->theta_o;
    uVar33._0_4_ = a->theta_e;
    uVar33._4_4_ = a->cosTheta_o;
    uVar34._0_4_ = a->cosTheta_e;
    uVar34._4_1_ = a->twoSided;
    uVar34._5_3_ = *(undefined3 *)&a->field_0x39;
  }
  else {
    uVar20._0_4_ = (b->b).pMin.super_Tuple3<pbrt::Point3,_float>.x;
    uVar20._4_4_ = (b->b).pMin.super_Tuple3<pbrt::Point3,_float>.y;
    uVar24 = *(undefined8 *)&(b->b).pMin.super_Tuple3<pbrt::Point3,_float>.z;
    uVar25._0_4_ = (b->b).pMax.super_Tuple3<pbrt::Point3,_float>.y;
    uVar25._4_4_ = (b->b).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar26._0_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar26._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar27._0_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar27._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar32._0_4_ = b->phi;
    uVar32._4_4_ = b->theta_o;
    uVar33._0_4_ = b->theta_e;
    uVar33._4_4_ = b->cosTheta_o;
    uVar34._0_4_ = b->cosTheta_e;
    uVar34._4_1_ = b->twoSided;
    uVar34._5_3_ = *(undefined3 *)&b->field_0x39;
  }
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)uVar27;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)uVar27 >> 0x20);
  __return_storage_ptr__->phi = (Float)(int)uVar32;
  __return_storage_ptr__->theta_o = (Float)(int)((ulong)uVar32 >> 0x20);
  __return_storage_ptr__->theta_e = (Float)(int)uVar33;
  __return_storage_ptr__->cosTheta_o = (Float)(int)((ulong)uVar33 >> 0x20);
  __return_storage_ptr__->cosTheta_e = (Float)(int)uVar34;
  __return_storage_ptr__->twoSided = (bool)(char)((ulong)uVar34 >> 0x20);
  *(int3 *)&__return_storage_ptr__->field_0x39 = (int3)((ulong)uVar34 >> 0x28);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar20;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar20 >> 0x20);
  *(undefined8 *)&(__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar24;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar25;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z =
       (float)(int)((ulong)uVar25 >> 0x20);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar26;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar26 >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

LightBounds Union(const LightBounds &a, const LightBounds &b) {
    if (a.phi == 0)
        return b;
    if (b.phi == 0)
        return a;
    DirectionCone c =
        Union(DirectionCone(a.w, a.cosTheta_o), DirectionCone(b.w, b.cosTheta_o));
    Float theta_o = SafeACos(c.cosTheta);
    return LightBounds(Union(a.b, b.b), c.w, a.phi + b.phi, theta_o,
                       std::max(a.theta_e, b.theta_e), a.twoSided | b.twoSided);
}